

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O2

int __thiscall
ncnn::Net::register_custom_layer
          (Net *this,char *type,layer_creator_func creator,layer_destroyer_func destroyer,
          void *userdata)

{
  pointer pcVar1;
  int iVar2;
  int iVar3;
  custom_layer_registry_entry entry;
  
  iVar2 = layer_to_index(type);
  if (iVar2 == -1) {
    iVar3 = (*this->_vptr_Net[2])(this,type);
    if (iVar3 == -1) {
      entry.name = type;
      entry.creator = creator;
      entry.destroyer = destroyer;
      entry.userdata = userdata;
      std::
      vector<ncnn::custom_layer_registry_entry,_std::allocator<ncnn::custom_layer_registry_entry>_>
      ::push_back(&this->d->custom_layer_registry,&entry);
      iVar2 = 0;
    }
    else {
      iVar2 = 0;
      fprintf(_stderr,"overwrite existing custom layer type %s",type);
      fputc(10,_stderr);
      pcVar1 = (this->d->custom_layer_registry).
               super__Vector_base<ncnn::custom_layer_registry_entry,_std::allocator<ncnn::custom_layer_registry_entry>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pcVar1[iVar3].name = type;
      pcVar1[iVar3].creator = creator;
      pcVar1[iVar3].destroyer = destroyer;
      pcVar1[iVar3].userdata = userdata;
    }
  }
  else {
    fprintf(_stderr,"can not register build-in layer type %s",type);
    fputc(10,_stderr);
    iVar2 = -1;
  }
  return iVar2;
}

Assistant:

int Net::register_custom_layer(const char* type, layer_creator_func creator, layer_destroyer_func destroyer, void* userdata)
{
    int typeindex = layer_to_index(type);
    if (typeindex != -1)
    {
        NCNN_LOGE("can not register build-in layer type %s", type);
        return -1;
    }

    int custom_index = custom_layer_to_index(type);
    if (custom_index == -1)
    {
        struct custom_layer_registry_entry entry = {type, creator, destroyer, userdata};
        d->custom_layer_registry.push_back(entry);
    }
    else
    {
        NCNN_LOGE("overwrite existing custom layer type %s", type);
        d->custom_layer_registry[custom_index].name = type;
        d->custom_layer_registry[custom_index].creator = creator;
        d->custom_layer_registry[custom_index].destroyer = destroyer;
        d->custom_layer_registry[custom_index].userdata = userdata;
    }

    return 0;
}